

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int should_switch_to_protocol(mg_connection *conn)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int local_68;
  int should_upgrade;
  int i;
  int connection_header_count;
  char *upgrade_to;
  char *connection_headers [8];
  mg_connection *conn_local;
  
  connection_headers[7] = (char *)conn;
  iVar2 = get_req_headers(&conn->request_info,"Connection",&upgrade_to,8);
  bVar1 = false;
  for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
    pcVar3 = mg_strcasestr(connection_headers[(long)local_68 + -1],"upgrade");
    if (pcVar3 != (char *)0x0) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    pcVar3 = mg_get_header((mg_connection *)connection_headers[7],"Upgrade");
    if (pcVar3 == (char *)0x0) {
      conn_local._4_4_ = -1;
    }
    else {
      pcVar4 = mg_strcasestr(pcVar3,"websocket");
      if (pcVar4 == (char *)0x0) {
        pcVar3 = mg_strcasestr(pcVar3,"h2");
        if (pcVar3 == (char *)0x0) {
          conn_local._4_4_ = -1;
        }
        else {
          conn_local._4_4_ = 2;
        }
      }
      else {
        conn_local._4_4_ = 1;
      }
    }
  }
  else {
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

static int
should_switch_to_protocol(const struct mg_connection *conn)
{
	const char *connection_headers[8];
	const char *upgrade_to;
	int connection_header_count, i, should_upgrade;

	/* A websocket protocol has the following HTTP headers:
	 *
	 * Connection: Upgrade
	 * Upgrade: Websocket
	 *
	 * It seems some clients use multiple headers:
	 * see https://github.com/civetweb/civetweb/issues/1083
	 */
	connection_header_count = get_req_headers(&conn->request_info,
	                                          "Connection",
	                                          connection_headers,
	                                          8);
	should_upgrade = 0;
	for (i = 0; i < connection_header_count; i++) {
		if (0 != mg_strcasestr(connection_headers[i], "upgrade")) {
			should_upgrade = 1;
		}
	}
	if (!should_upgrade) {
		return PROTOCOL_TYPE_HTTP1;
	}

	upgrade_to = mg_get_header(conn, "Upgrade");
	if (upgrade_to == NULL) {
		/* "Connection: Upgrade" without "Upgrade" Header --> Error */
		return -1;
	}

	/* Upgrade to ... */
	if (0 != mg_strcasestr(upgrade_to, "websocket")) {
		/* The headers "Host", "Sec-WebSocket-Key", "Sec-WebSocket-Protocol" and
		 * "Sec-WebSocket-Version" are also required.
		 * Don't check them here, since even an unsupported websocket protocol
		 * request still IS a websocket request (in contrast to a standard HTTP
		 * request). It will fail later in handle_websocket_request.
		 */
		return PROTOCOL_TYPE_WEBSOCKET; /* Websocket */
	}
	if (0 != mg_strcasestr(upgrade_to, "h2")) {
		return PROTOCOL_TYPE_HTTP2; /* Websocket */
	}

	/* Upgrade to another protocol */
	return -1;
}